

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ImpactGenerator.cpp
# Opt level: O2

void ImpactGenerator_AddImpact(int index,float volume,float decay,float cut,float bw)

{
  ImpactInstance *pIVar1;
  Impact local_18;
  
  pIVar1 = ImpactGenerator::GetImpactInstance(index);
  if ((pIVar1 != (ImpactInstance *)0x0) && (pIVar1->numimpacts < pIVar1->maximpacts)) {
    local_18.lpf = 0.0;
    local_18.bpf = 0.0;
    local_18.volume = volume;
    local_18.decay = decay;
    local_18.cut = cut;
    local_18.bw = bw;
    RingBuffer<1000,_ImpactGenerator::Impact>::Feed(&pIVar1->impactrb,&local_18);
  }
  return;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API void ImpactGenerator_AddImpact(int index, float volume, float decay, float cut, float bw)
    {
        ImpactInstance* instance = GetImpactInstance(index);
        if (instance == NULL)
            return;
        if (instance->numimpacts >= instance->maximpacts)
            return;
        Impact imp;
        imp.volume = volume;
        imp.decay = decay;
        imp.cut = cut;
        imp.bw = bw;
        imp.lpf = 0.0f;
        imp.bpf = 0.0f;
        instance->impactrb.Feed(imp);
    }